

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O1

void __thiscall L14_3::Worker::~Worker(Worker *this)

{
  pointer pcVar1;
  
  this->_vptr_Worker = (_func_int **)&PTR_show_data_00134470;
  pcVar1 = (this->_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->_name).field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

void Worker::set_data() {
        //  if "cin >> xxx" before "getline(cin, xxx)", might buggy
        //  https://stackoverflow.com/questions/12691316/getline-does-not-work-if-used-after-some-inputs
        std::cin.ignore();
        std::getline(std::cin, _name);
        std::cout << "Enter worker'is id: \n";
        std::cin >> _id;

        //  wait until enter a '\n'
        while(std::cin.get() != '\n') {
            continue;
        }
    }